

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

size_t spdlog::details::os::thread_id(void)

{
  char *pcVar1;
  size_t *psVar2;
  size_t sVar3;
  undefined1 *puVar4;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_00180d60);
  if (*pcVar1 == '\0') {
    sVar3 = _thread_id();
    psVar2 = (size_t *)__tls_get_addr(&PTR_00180e20);
    *psVar2 = sVar3;
    puVar4 = (undefined1 *)__tls_get_addr(&PTR_00180d60);
    *puVar4 = 1;
  }
  else {
    psVar2 = (size_t *)__tls_get_addr(&PTR_00180e20);
  }
  return *psVar2;
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT
{
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}